

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_Inventory(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  DObject *this;
  DObject *this_00;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00430d5d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00430d44:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00430d5d:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x338,
                  "int AF_AActor_Inventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this_00 = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (DObject *)0x0) goto LAB_00430cab;
    bVar1 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00430d5d;
    }
  }
  else {
    if (this_00 != (DObject *)0x0) goto LAB_00430d44;
LAB_00430cab:
    this_00 = (DObject *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00430d7c;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00430d4d:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00430d7c;
  }
  this = (DObject *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_00430cda;
  }
  else {
    if (this != (DObject *)0x0) goto LAB_00430d4d;
LAB_00430cda:
    NullParam("\"item\"");
    this = (DObject *)param[1].field_0.field_1.a;
    if (this == (DObject *)0x0) {
      this = (DObject *)0x0;
      goto LAB_00430d11;
    }
  }
  bVar1 = DObject::IsKindOf(this,AInventory::RegistrationInfo.MyClass);
  if (!bVar1) {
    pcVar4 = "item == NULL || item->IsKindOf(RUNTIME_CLASS(AInventory))";
LAB_00430d7c:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x339,
                  "int AF_AActor_Inventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_00430d11:
  uVar2 = (*this_00->_vptr_DObject[0x17])(this_00,this);
  if (numret < 1) {
    iVar3 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x33a,
                    "int AF_AActor_Inventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,uVar2 & 0xff);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Inventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(item, AInventory);
	ACTION_RETURN_BOOL(self->UseInventory(item));
}